

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool DecodeRawPSBT(PartiallySignedTransaction *psbt,Span<const_std::byte> tx_data,string *error)

{
  Span<const_std::byte> sp;
  bool bVar1;
  long in_FS_OFFSET;
  exception *e;
  DataStream ss_data;
  DataStream *in_stack_ffffffffffffff68;
  PartiallySignedTransaction *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94 [12];
  DataStream local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sp._4_12_ = in_stack_ffffffffffffff94;
  sp.m_data._0_4_ = in_stack_ffffffffffffff90;
  DataStream::DataStream(&local_38,sp);
  DataStream::operator>>
            ((DataStream *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
             in_stack_ffffffffffffff70);
  bVar1 = DataStream::empty((DataStream *)
                            CONCAT17(in_stack_ffffffffffffff7f,
                                     CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)))
  ;
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
               (char *)in_stack_ffffffffffffff70);
  }
  DataStream::~DataStream(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool DecodeRawPSBT(PartiallySignedTransaction& psbt, Span<const std::byte> tx_data, std::string& error)
{
    DataStream ss_data{tx_data};
    try {
        ss_data >> psbt;
        if (!ss_data.empty()) {
            error = "extra data after PSBT";
            return false;
        }
    } catch (const std::exception& e) {
        error = e.what();
        return false;
    }
    return true;
}